

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_key_derivation_tls12_prf_generate_next_block
          (psa_tls12_prf_key_derivation_t *tls12_prf,psa_algorithm_t alg)

{
  uint uVar1;
  psa_status_t pVar2;
  undefined1 local_114;
  int local_10c;
  psa_status_t cleanup_status;
  psa_status_t status;
  psa_hash_operation_t backup;
  uint8_t hash_length;
  psa_algorithm_t hash_alg;
  psa_algorithm_t alg_local;
  psa_tls12_prf_key_derivation_t *tls12_prf_local;
  
  uVar1 = alg & 0xff;
  if ((uVar1 | 0x1000000) == 0x1000001) {
    local_114 = 0x10;
  }
  else if ((uVar1 | 0x1000000) == 0x1000002) {
    local_114 = 0x10;
  }
  else if ((uVar1 | 0x1000000) == 0x1000003) {
    local_114 = 0x10;
  }
  else if ((uVar1 | 0x1000000) == 0x1000004) {
    local_114 = 0x14;
  }
  else if ((uVar1 | 0x1000000) == 0x1000005) {
    local_114 = 0x14;
  }
  else if ((uVar1 | 0x1000000) == 0x1000008) {
    local_114 = 0x1c;
  }
  else if ((uVar1 | 0x1000000) == 0x1000009) {
    local_114 = 0x20;
  }
  else if ((uVar1 | 0x1000000) == 0x100000a) {
    local_114 = 0x30;
  }
  else if ((uVar1 | 0x1000000) == 0x100000b) {
    local_114 = 0x40;
  }
  else if ((uVar1 | 0x1000000) == 0x100000c) {
    local_114 = 0x1c;
  }
  else if ((uVar1 | 0x1000000) == 0x100000d) {
    local_114 = 0x20;
  }
  else if ((uVar1 | 0x1000000) == 0x1000010) {
    local_114 = 0x1c;
  }
  else if ((uVar1 | 0x1000000) == 0x1000011) {
    local_114 = 0x20;
  }
  else if ((uVar1 | 0x1000000) == 0x1000012) {
    local_114 = 0x30;
  }
  else {
    local_114 = 0;
    if ((uVar1 | 0x1000000) == 0x1000013) {
      local_114 = 0x40;
    }
  }
  backup.ctx._215_1_ = local_114;
  memset(&cleanup_status,0,0xe0);
  if (tls12_prf->block_number == 0xff) {
    return -0x97;
  }
  tls12_prf->block_number = tls12_prf->block_number + '\x01';
  tls12_prf->left_in_block = backup.ctx._215_1_;
  local_10c = psa_hash_clone(&(tls12_prf->hmac).hash_ctx,(psa_hash_operation_t *)&cleanup_status);
  if (local_10c == 0) {
    if (tls12_prf->block_number == '\x01') {
      local_10c = psa_hash_update(&(tls12_prf->hmac).hash_ctx,tls12_prf->label,
                                  tls12_prf->label_length);
      if (local_10c != 0) goto LAB_00117b5d;
      local_10c = psa_hash_update(&(tls12_prf->hmac).hash_ctx,tls12_prf->seed,tls12_prf->seed_length
                                 );
    }
    else {
      local_10c = psa_hash_update(&(tls12_prf->hmac).hash_ctx,tls12_prf->Ai,
                                  (ulong)(byte)backup.ctx._215_1_);
    }
    if (((((local_10c == 0) &&
          (local_10c = psa_hmac_finish_internal
                                 (&tls12_prf->hmac,tls12_prf->Ai,(ulong)(byte)backup.ctx._215_1_),
          local_10c == 0)) &&
         (local_10c = psa_hash_clone((psa_hash_operation_t *)&cleanup_status,
                                     &(tls12_prf->hmac).hash_ctx), local_10c == 0)) &&
        ((local_10c = psa_hash_update(&(tls12_prf->hmac).hash_ctx,tls12_prf->Ai,
                                      (ulong)(byte)backup.ctx._215_1_), local_10c == 0 &&
         (local_10c = psa_hash_update(&(tls12_prf->hmac).hash_ctx,tls12_prf->label,
                                      tls12_prf->label_length), local_10c == 0)))) &&
       ((local_10c = psa_hash_update(&(tls12_prf->hmac).hash_ctx,tls12_prf->seed,
                                     tls12_prf->seed_length), local_10c == 0 &&
        (local_10c = psa_hmac_finish_internal
                               (&tls12_prf->hmac,tls12_prf->output_block,
                                (ulong)(byte)backup.ctx._215_1_), local_10c == 0)))) {
      local_10c = psa_hash_clone((psa_hash_operation_t *)&cleanup_status,&(tls12_prf->hmac).hash_ctx
                                );
    }
  }
LAB_00117b5d:
  pVar2 = psa_hash_abort((psa_hash_operation_t *)&cleanup_status);
  if ((local_10c == 0) && (pVar2 != 0)) {
    local_10c = pVar2;
  }
  return local_10c;
}

Assistant:

static psa_status_t psa_key_derivation_tls12_prf_generate_next_block(
    psa_tls12_prf_key_derivation_t *tls12_prf,
    psa_algorithm_t alg )
{
    psa_algorithm_t hash_alg = PSA_ALG_HKDF_GET_HASH( alg );
    uint8_t hash_length = PSA_HASH_SIZE( hash_alg );
    psa_hash_operation_t backup = PSA_HASH_OPERATION_INIT;
    psa_status_t status, cleanup_status;

    /* We can't be wanting more output after block 0xff, otherwise
     * the capacity check in psa_key_derivation_output_bytes() would have
     * prevented this call. It could happen only if the operation
     * object was corrupted or if this function is called directly
     * inside the library. */
    if( tls12_prf->block_number == 0xff )
        return( PSA_ERROR_CORRUPTION_DETECTED );

    /* We need a new block */
    ++tls12_prf->block_number;
    tls12_prf->left_in_block = hash_length;

    /* Recall the definition of the TLS-1.2-PRF from RFC 5246:
     *
     * PRF(secret, label, seed) = P_<hash>(secret, label + seed)
     *
     * P_hash(secret, seed) = HMAC_hash(secret, A(1) + seed) +
     *                        HMAC_hash(secret, A(2) + seed) +
     *                        HMAC_hash(secret, A(3) + seed) + ...
     *
     * A(0) = seed
     * A(i) = HMAC_hash(secret, A(i-1))
     *
     * The `psa_tls12_prf_key_derivation` structure saves the block
     * `HMAC_hash(secret, A(i) + seed)` from which the output
     * is currently extracted as `output_block` and where i is
     * `block_number`.
     */

    /* Save the hash context before using it, to preserve the hash state with
     * only the inner padding in it. We need this, because inner padding depends
     * on the key (secret in the RFC's terminology). */
    status = psa_hash_clone( &tls12_prf->hmac.hash_ctx, &backup );
    if( status != PSA_SUCCESS )
        goto cleanup;

    /* Calculate A(i) where i = tls12_prf->block_number. */
    if( tls12_prf->block_number == 1 )
    {
        /* A(1) = HMAC_hash(secret, A(0)), where A(0) = seed. (The RFC overloads
         * the variable seed and in this instance means it in the context of the
         * P_hash function, where seed = label + seed.) */
        status = psa_hash_update( &tls12_prf->hmac.hash_ctx,
                                  tls12_prf->label, tls12_prf->label_length );
        if( status != PSA_SUCCESS )
            goto cleanup;
        status = psa_hash_update( &tls12_prf->hmac.hash_ctx,
                                  tls12_prf->seed, tls12_prf->seed_length );
        if( status != PSA_SUCCESS )
            goto cleanup;
    }
    else
    {
        /* A(i) = HMAC_hash(secret, A(i-1)) */
        status = psa_hash_update( &tls12_prf->hmac.hash_ctx,
                                  tls12_prf->Ai, hash_length );
        if( status != PSA_SUCCESS )
            goto cleanup;
    }

    status = psa_hmac_finish_internal( &tls12_prf->hmac,
                                       tls12_prf->Ai, hash_length );
    if( status != PSA_SUCCESS )
        goto cleanup;
    status = psa_hash_clone( &backup, &tls12_prf->hmac.hash_ctx );
    if( status != PSA_SUCCESS )
        goto cleanup;

    /* Calculate HMAC_hash(secret, A(i) + label + seed). */
    status = psa_hash_update( &tls12_prf->hmac.hash_ctx,
                              tls12_prf->Ai, hash_length );
    if( status != PSA_SUCCESS )
        goto cleanup;
    status = psa_hash_update( &tls12_prf->hmac.hash_ctx,
                              tls12_prf->label, tls12_prf->label_length );
    if( status != PSA_SUCCESS )
        goto cleanup;
    status = psa_hash_update( &tls12_prf->hmac.hash_ctx,
                              tls12_prf->seed, tls12_prf->seed_length );
    if( status != PSA_SUCCESS )
        goto cleanup;
    status = psa_hmac_finish_internal( &tls12_prf->hmac,
                                       tls12_prf->output_block, hash_length );
    if( status != PSA_SUCCESS )
        goto cleanup;
    status = psa_hash_clone( &backup, &tls12_prf->hmac.hash_ctx );
    if( status != PSA_SUCCESS )
        goto cleanup;


cleanup:

    cleanup_status = psa_hash_abort( &backup );
    if( status == PSA_SUCCESS && cleanup_status != PSA_SUCCESS )
        status = cleanup_status;

    return( status );
}